

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadZSegs(FileReaderBase *data)

{
  line_t *plVar1;
  uint uVar2;
  side_t *psVar3;
  line_t *plVar4;
  long lVar5;
  long lVar6;
  BYTE side;
  WORD line;
  DWORD v2;
  DWORD v1;
  byte local_3b;
  ushort local_3a;
  uint local_38;
  uint local_34;
  
  if (0 < numsegs) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      (*data->_vptr_FileReaderBase[2])(data,&local_34,4);
      (*data->_vptr_FileReaderBase[2])(data,&local_38,4);
      (*data->_vptr_FileReaderBase[2])(data,&local_3a,2);
      (*data->_vptr_FileReaderBase[2])(data,&local_3b,1);
      *(vertex_t **)((long)&segs->v1 + lVar5) = vertexes + local_34;
      *(vertex_t **)((long)&segs->v2 + lVar5) = vertexes + local_38;
      plVar4 = lines;
      plVar1 = lines + local_3a;
      *(line_t **)((long)&segs->linedef + lVar5) = plVar1;
      psVar3 = plVar1->sidedef[local_3b];
      *(side_t **)((long)&segs->sidedef + lVar5) = psVar3;
      *(sector_t **)((long)&segs->frontsector + lVar5) = psVar3->sector;
      uVar2 = plVar4[local_3a].flags;
      if (((uVar2 & 4) == 0) || (plVar1->sidedef[local_3b ^ 1] == (side_t *)0x0)) {
        *(undefined8 *)((long)&segs->backsector + lVar5) = 0;
        plVar1->flags = uVar2 & 0xfffffffb;
      }
      else {
        *(sector_t **)((long)&segs->backsector + lVar5) = plVar1->sidedef[local_3b ^ 1]->sector;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x48;
    } while (lVar6 < numsegs);
  }
  return;
}

Assistant:

void P_LoadZSegs (FileReaderBase &data)
{
	for (int i = 0; i < numsegs; ++i)
	{
		line_t *ldef;
		DWORD v1, v2;
		WORD line;
		BYTE side;

		data >> v1 >> v2 >> line >> side;

		segs[i].v1 = &vertexes[v1];
		segs[i].v2 = &vertexes[v2];
		segs[i].linedef = ldef = &lines[line];
		segs[i].sidedef = ldef->sidedef[side];
		segs[i].frontsector = ldef->sidedef[side]->sector;
		if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
		{
			segs[i].backsector = ldef->sidedef[side^1]->sector;
		}
		else
		{
			segs[i].backsector = 0;
			ldef->flags &= ~ML_TWOSIDED;
		}
	}
}